

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_class.c
# Opt level: O1

void pd_forwardmess(t_pd *x,int argc,t_atom *argv)

{
  t_atomtype tVar1;
  
  if (argc == 0) {
    return;
  }
  tVar1 = argv->a_type;
  if (tVar1 == A_FLOAT) {
    if (argc == 1) {
      pd_float(x,(argv->a_w).w_float);
      return;
    }
  }
  else {
    if (tVar1 != A_POINTER) {
      if (tVar1 == A_SYMBOL) {
        pd_typedmess(x,(argv->a_w).w_symbol,argc + -1,argv + 1);
        return;
      }
      bug("pd_forwardmess");
      return;
    }
    if (argc == 1) {
      pd_pointer(x,(argv->a_w).w_gpointer);
      return;
    }
  }
  pd_list(x,&s_list,argc,argv);
  return;
}

Assistant:

void pd_forwardmess(t_pd *x, int argc, t_atom *argv)
{
    if (argc)
    {
        t_atomtype t = argv->a_type;
        if (t == A_SYMBOL) pd_typedmess(x, argv->a_w.w_symbol, argc-1, argv+1);
        else if (t == A_POINTER)
        {
            if (argc == 1) pd_pointer(x, argv->a_w.w_gpointer);
            else pd_list(x, &s_list, argc, argv);
        }
        else if (t == A_FLOAT)
        {
            if (argc == 1) pd_float(x, argv->a_w.w_float);
            else pd_list(x, &s_list, argc, argv);
        }
        else bug("pd_forwardmess");
    }

}